

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_node_comment
               (fy_emitter *emit,fy_node *fyn,int flags,int indent,fy_comment_placement placement)

{
  long lVar1;
  int flags_00;
  fy_token *fyt;
  
  if (fycp_bottom < placement) {
    return;
  }
  if ((emit->cfg->flags & FYECF_OUTPUT_COMMENTS) == FYECF_DOC_END_MARK_AUTO) {
    return;
  }
  if (fyn == (fy_node *)0x0) {
switchD_00126402_caseD_3:
    flags_00 = flags;
    fyt = (fy_token *)0x0;
  }
  else {
    flags_00 = 0x1482a8;
    flags = 0x1482a8;
    switch(fyn->field_0x34 & 3) {
    case 0:
      lVar1 = 0x48;
      break;
    default:
      lVar1 = 0x58;
      break;
    case 3:
      goto switchD_00126402_caseD_3;
    }
    fyt = *(fy_token **)((long)&(fyn->node).next + lVar1);
  }
  if (fyt == (fy_token *)0x0) {
    return;
  }
  fy_emit_token_comment(emit,fyt,flags_00,indent,placement);
  return;
}

Assistant:

void fy_emit_node_comment(struct fy_emitter *emit, struct fy_node *fyn, int flags, int indent,
                          enum fy_comment_placement placement) {
    struct fy_token *fyt;

    if (!fy_emit_output_comments(emit) || (unsigned int) placement >= fycp_max)
        return;

    fyt = fy_node_value_token(fyn);
    if (!fyt)
        return;

    fy_emit_token_comment(emit, fyt, flags, indent, placement);
}